

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
* __thiscall
cfd::core::ConfidentialTransaction::GetTxInList
          (vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
           *__return_storage_ptr__,ConfidentialTransaction *this)

{
  bool bVar1;
  reference pCVar2;
  ConfidentialTxInReference local_308;
  undefined1 local_198 [8];
  ConfidentialTxIn tx_in;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *__range2;
  ConfidentialTransaction *this_local;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *refs;
  
  ::std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::vector(__return_storage_ptr__);
  __end2 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ::begin(&this->vin_);
  tx_in.pegin_witness_.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)::std::
                vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
                end(&this->vin_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
                                     *)&tx_in.pegin_witness_.witness_stack_.
                                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)
  {
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
             ::operator*(&__end2);
    ConfidentialTxIn::ConfidentialTxIn((ConfidentialTxIn *)local_198,pCVar2);
    ConfidentialTxInReference::ConfidentialTxInReference(&local_308,(ConfidentialTxIn *)local_198);
    ::std::
    vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
    ::push_back(__return_storage_ptr__,&local_308);
    ConfidentialTxInReference::~ConfidentialTxInReference(&local_308);
    ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)local_198);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<ConfidentialTxInReference>  // force LF
ConfidentialTransaction::GetTxInList() const {
  std::vector<ConfidentialTxInReference> refs;
  for (ConfidentialTxIn tx_in : vin_) {
    refs.push_back(ConfidentialTxInReference(tx_in));
  }
  return refs;
}